

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall r_comp::Compiler::is_object(Compiler *this,Ptr *node,Class *p)

{
  element_type *peVar1;
  size_t __n;
  int iVar2;
  
  peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __n = (peVar1->cmd)._M_string_length;
  if (__n != (p->str_opcode)._M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar2 = bcmp((peVar1->cmd)._M_dataplus._M_p,(p->str_opcode)._M_dataplus._M_p,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool Compiler::is_object(RepliStruct::Ptr node, const Class &p)
{
    return (node->cmd == p.str_opcode);
}